

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_InternalSerialize
          (DescriptorProto_ExtensionRange *this,uint8 *target,EpsCopyOutputStream *stream)

{
  ExtensionRangeOptions *this_00;
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar4 = this->start_;
    *target = '\b';
    if ((ulong)(long)(int)uVar4 < 0x80) {
      target[1] = (byte)uVar4;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      uVar5 = (ulong)(long)(int)uVar4 >> 7;
      if (uVar4 < 0x4000) {
        target[2] = (uint8)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar7 = target;
          puVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = puVar7 + 1;
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar2);
        *puVar7 = (uint8)uVar6;
      }
    }
  }
  if ((uVar3 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar4 = this->end_;
    *target = '\x10';
    if ((ulong)(long)(int)uVar4 < 0x80) {
      target[1] = (byte)uVar4;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      uVar5 = (ulong)(long)(int)uVar4 >> 7;
      if (uVar4 < 0x4000) {
        target[2] = (uint8)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar7 = target;
          puVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = puVar7 + 1;
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar2);
        *puVar7 = (uint8)uVar6;
      }
    }
  }
  if ((uVar3 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = '\x1a';
    uVar3 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar3 < 0x80) {
      target[1] = (byte)uVar3;
      puVar7 = target + 2;
    }
    else {
      target[1] = (byte)uVar3 | 0x80;
      if (uVar3 < 0x4000) {
        target[2] = (uint8)(uVar3 >> 7);
        puVar7 = target + 3;
      }
      else {
        puVar7 = target + 3;
        uVar3 = uVar3 >> 7;
        do {
          puVar8 = puVar7;
          puVar8[-1] = (byte)uVar3 | 0x80;
          uVar4 = uVar3 >> 7;
          puVar7 = puVar8 + 1;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar2);
        *puVar8 = (uint8)uVar4;
      }
    }
    target = ExtensionRangeOptions::_InternalSerialize(this_00,puVar7,stream);
  }
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    return target;
  }
  puVar7 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar7;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto_ExtensionRange::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto.ExtensionRange)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 start = 1;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_start(), target);
  }

  // optional int32 end = 2;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_end(), target);
  }

  // optional .google.protobuf.ExtensionRangeOptions options = 3;
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto.ExtensionRange)
  return target;
}